

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putRGBUAcontig8bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  uVar2 = img->samplesperpixel;
  while (bVar6 = h != 0, h = h - 1, bVar6) {
    lVar5 = (long)toskew * -4;
    for (lVar4 = 0; w != (uint32_t)lVar4; lVar4 = lVar4 + 1) {
      bVar1 = pp[3];
      puVar3 = img->UaToAa;
      cp[lVar4] = (uint)bVar1 << 0x18 | (uint)puVar3[(ulong)*pp + (ulong)bVar1 * 0x100] |
                  (uint)puVar3[(ulong)pp[1] + (ulong)bVar1 * 0x100] << 8 |
                  (uint)puVar3[(ulong)pp[2] + (ulong)bVar1 * 0x100] << 0x10;
      pp = pp + uVar2;
      lVar5 = lVar5 + -4;
    }
    cp = (uint32_t *)((long)cp - lVar5);
    pp = pp + (int)(fromskew * (uint)uVar2);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBUAcontig8bittile)
{
    int samplesperpixel = img->samplesperpixel;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        uint32_t r, g, b, a;
        uint8_t *m;
        for (x = w; x > 0; --x)
        {
            a = pp[3];
            m = img->UaToAa + ((size_t)a << 8);
            r = m[pp[0]];
            g = m[pp[1]];
            b = m[pp[2]];
            *cp++ = PACK4(r, g, b, a);
            pp += samplesperpixel;
        }
        cp += toskew;
        pp += fromskew;
    }
}